

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implementation.cpp
# Opt level: O2

my_array<double> *
custom_array::bindgen_make_fortran_array_view<double>
          (my_array<double> *__return_storage_ptr__,bindgen_fortran_array_descriptor *descriptor,
          my_array<double> *param_2)

{
  int iVar1;
  undefined8 uVar2;
  runtime_error *this;
  
  if (descriptor->rank == 3) {
    __return_storage_ptr__->data = (double *)descriptor->data;
    iVar1 = descriptor->dims[0];
    (__return_storage_ptr__->sizes)._M_elems[0] = iVar1;
    uVar2 = *(undefined8 *)(descriptor->dims + 1);
    *(undefined8 *)((__return_storage_ptr__->sizes)._M_elems + 1) = uVar2;
    (__return_storage_ptr__->strides)._M_elems[0] = 1;
    (__return_storage_ptr__->strides)._M_elems[1] = iVar1;
    (__return_storage_ptr__->strides)._M_elems[2] = (int)uVar2 * iVar1;
    return __return_storage_ptr__;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"only 3-dimensional arrays are supported");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

my_array<T> bindgen_make_fortran_array_view(bindgen_fortran_array_descriptor *descriptor, my_array<T> *) {
        if (descriptor->rank != 3) {
            throw std::runtime_error("only 3-dimensional arrays are supported");
        }
        return my_array<T>{static_cast<T *>(descriptor->data),
            {descriptor->dims[0], descriptor->dims[1], descriptor->dims[2]},
            {1, descriptor->dims[0], descriptor->dims[0] * descriptor->dims[1]}};
    }